

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall
c4::basic_substring<const_char>::first_of
          (basic_substring<const_char> *this,ro_substr chars,size_t start)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  basic_substring<const_char> *pbVar4;
  ulong uVar5;
  basic_substring<const_char> *pbVar6;
  ulong uVar7;
  
  uVar5 = chars.len;
  pbVar6 = this;
  if ((start != 0xffffffffffffffff) && (this->len < start)) {
    basic_substring<char_const>::first_of();
  }
  pbVar4 = (basic_substring<const_char> *)0xffffffffffffffff;
  if (start < (basic_substring<const_char> *)this->len) {
    do {
      pbVar4 = pbVar6;
      bVar2 = uVar5 != 0;
      if ((uVar5 != 0) &&
         (cVar1 = *(char *)((long)&((basic_substring<const_char> *)start)->str + (long)this->str),
         pbVar4 = (basic_substring<const_char> *)start, cVar1 != *chars.str)) {
        uVar3 = 1;
        do {
          uVar7 = uVar3;
          pbVar4 = pbVar6;
          if (uVar5 == uVar7) break;
          pbVar4 = (basic_substring<const_char> *)start;
          uVar3 = uVar7 + 1;
        } while (cVar1 != chars.str[uVar7]);
        bVar2 = uVar7 < uVar5;
      }
      pbVar6 = pbVar4;
      pbVar4 = pbVar6;
    } while ((!bVar2) &&
            (start = (long)&((basic_substring<const_char> *)start)->str + 1,
            pbVar4 = (basic_substring<const_char> *)0xffffffffffffffff,
            (basic_substring<const_char> *)start != (basic_substring<const_char> *)this->len));
  }
  return (size_t)pbVar4;
}

Assistant:

size_t first_of(ro_substr chars, size_t start=0) const
    {
        C4_ASSERT(start == npos || (start >= 0 && start <= len));
        for(size_t i = start; i < len; ++i)
        {
            for(size_t j = 0; j < chars.len; ++j)
            {
                if(str[i] == chars[j])
                    return i;
            }
        }
        return npos;
    }